

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Abc_Cex_t * Vga_ManDeriveCex(Vta_Man_t *p)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  undefined8 uVar3;
  Abc_Cex_t *pAVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  
  iVar6 = p->pGia->nRegs;
  pAVar4 = Abc_CexAlloc(iVar6,p->pGia->vCis->nSize - iVar6,p->pPars->iFrame + 1);
  pAVar4->iPo = 0;
  pAVar4->iFrame = p->pPars->iFrame;
  iVar6 = p->nObjs;
  if (1 < iVar6) {
    pGVar2 = p->pGia;
    piVar7 = &p->pObjs[1].iFrame;
    lVar8 = 1;
    do {
      iVar1 = ((Vta_Obj_t *)(piVar7 + -1))->iObj;
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) {
        return pAVar4;
      }
      uVar3 = *(undefined8 *)(pGVar2->pObjs + iVar1);
      if (((~(uint)uVar3 & 0x9fffffff) == 0) &&
         (uVar5 = (uint)((ulong)uVar3 >> 0x20) & 0x1fffffff,
         (int)uVar5 < pGVar2->vCis->nSize - pGVar2->nRegs)) {
        if (p->pSat->size <= lVar8) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
        }
        if (p->pSat->model[lVar8] == 1) {
          iVar6 = uVar5 + pAVar4->nRegs + pAVar4->nPis * *piVar7;
          (&pAVar4[1].iPo)[iVar6 >> 5] = (&pAVar4[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
          iVar6 = p->nObjs;
        }
      }
      lVar8 = lVar8 + 1;
      piVar7 = piVar7 + 4;
    } while (lVar8 < iVar6);
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Vga_ManDeriveCex( Vta_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    int i;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Vta_ManForEachObjObj( p, pThis, pObj, i )
        if ( Gia_ObjIsPi(p->pGia, pObj) && sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) )
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + pThis->iFrame * pCex->nPis + Gia_ObjCioId(pObj) );
    return pCex;
}